

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::AsyncCapabilityStream::ReadResult> * __thiscall
kj::_::NullableValue<kj::AsyncCapabilityStream::ReadResult>::operator=
          (NullableValue<kj::AsyncCapabilityStream::ReadResult> *this,
          NullableValue<kj::AsyncCapabilityStream::ReadResult> *other)

{
  size_t sVar1;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
    }
    if (other->isSet == true) {
      sVar1 = (other->field_1).value.capCount;
      (this->field_1).value.byteCount = (other->field_1).value.byteCount;
      (this->field_1).value.capCount = sVar1;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }